

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O1

void __thiscall polyscope::SurfaceMesh::drawPick(SurfaceMesh *this)

{
  bool bVar1;
  
  bVar1 = Structure::isEnabled((Structure *)this);
  if (bVar1) {
    if ((this->pickProgram).
        super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      preparePick(this);
    }
    (**(code **)(*render::engine + 0x68))(render::engine,(this->backFacePolicy).value == Cull);
    Structure::setStructureUniforms
              ((Structure *)this,
               (this->pickProgram).
               super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    (*((this->pickProgram).
       super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ShaderProgram[0x24])();
    (**(code **)(*render::engine + 0x68))(render::engine,0);
    return;
  }
  return;
}

Assistant:

void SurfaceMesh::drawPick() {
  if (!isEnabled()) {
    return;
  }

  if (pickProgram == nullptr) {
    preparePick();
  }

  render::engine->setBackfaceCull(backFacePolicy.get() == BackFacePolicy::Cull);

  // Set uniforms
  setStructureUniforms(*pickProgram);

  pickProgram->draw();

  render::engine->setBackfaceCull(); // return to default setting
}